

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001d5a40 = 0x2d2d2d2d2d2d2d;
    uRam00000000001d5a47 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001d5a30 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001d5a38 = 0x2d2d2d2d2d2d2d;
    DAT_001d5a3f = 0x2d;
    _DAT_001d5a20 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001d5a28 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001d5a10 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001d5a18 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001d5a08 = 0x2d2d2d2d2d2d2d2d;
    DAT_001d5a4f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }